

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O3

bool __thiscall glslang::HlslGrammar::acceptConstructor(HlslGrammar *this,TIntermTyped **node)

{
  HlslToken *loc;
  HlslParseContext *this_00;
  bool bVar1;
  TFunction *function;
  TIntermTyped *pTVar2;
  TIntermNode *nodeList;
  TType type;
  TIntermTyped *local_c8;
  TType local_c0;
  
  TType::TType(&local_c0,EbtVoid,EvqTemporary,1,0,0,false);
  local_c8 = (TIntermTyped *)0x0;
  bVar1 = acceptType(this,&local_c0,(TIntermNode **)&local_c8);
  if (bVar1) {
    loc = &(this->super_HlslTokenStream).token;
    function = HlslParseContext::makeConstructorCall(this->parseContext,&loc->loc,&local_c0);
    if (function != (TFunction *)0x0) {
      local_c8 = (TIntermTyped *)0x0;
      bVar1 = acceptArguments(this,function,&local_c8);
      if (bVar1) {
        this_00 = this->parseContext;
        if (local_c8 == (TIntermTyped *)0x0) {
          (*(this_00->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this_00,loc,"Expected","one or more arguments","");
          return false;
        }
        pTVar2 = HlslParseContext::handleFunctionCall(this_00,&loc->loc,function,local_c8);
        *node = pTVar2;
        return pTVar2 != (TIntermTyped *)0x0;
      }
      HlslTokenStream::recedeToken(&this->super_HlslTokenStream);
    }
  }
  return false;
}

Assistant:

bool HlslGrammar::acceptConstructor(TIntermTyped*& node)
{
    // type
    TType type;
    if (acceptType(type)) {
        TFunction* constructorFunction = parseContext.makeConstructorCall(token.loc, type);
        if (constructorFunction == nullptr)
            return false;

        // arguments
        TIntermTyped* arguments = nullptr;
        if (! acceptArguments(constructorFunction, arguments)) {
            // It's possible this is a type keyword used as an identifier.  Put the token back
            // for later use.
            recedeToken();
            return false;
        }

        if (arguments == nullptr) {
            expected("one or more arguments");
            return false;
        }

        // hook it up
        node = parseContext.handleFunctionCall(token.loc, constructorFunction, arguments);

        return node != nullptr;
    }

    return false;
}